

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O2

bool __thiscall
wallet::WalletBatch::WriteDescriptorDerivedCache
          (WalletBatch *this,CExtPubKey *xpub,uint256 *desc_id,uint32_t key_exp_index,
          uint32_t der_index)

{
  bool bVar1;
  pair<unsigned_int,_unsigned_int> pVar2;
  long in_FS_OFFSET;
  vector<unsigned_char,_std::allocator<unsigned_char>_> ser_xpub;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_uint256>
  local_c0;
  pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_uint256>,_std::pair<unsigned_int,_unsigned_int>_>
  local_80;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&ser_xpub,0x4a,(allocator_type *)&local_80);
  CExtPubKey::Encode(xpub,ser_xpub.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  std::__cxx11::string::string
            ((string *)&local_c0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             DBKeys::WALLETDESCRIPTORCACHE_abi_cxx11_);
  local_c0.second.super_base_blob<256U>.m_data._M_elems._0_8_ =
       *(undefined8 *)(desc_id->super_base_blob<256U>).m_data._M_elems;
  local_c0.second.super_base_blob<256U>.m_data._M_elems._8_8_ =
       *(undefined8 *)((desc_id->super_base_blob<256U>).m_data._M_elems + 8);
  local_c0.second.super_base_blob<256U>.m_data._M_elems._16_8_ =
       *(undefined8 *)((desc_id->super_base_blob<256U>).m_data._M_elems + 0x10);
  local_c0.second.super_base_blob<256U>.m_data._M_elems._24_8_ =
       *(undefined8 *)((desc_id->super_base_blob<256U>).m_data._M_elems + 0x18);
  pVar2.second = der_index;
  pVar2.first = key_exp_index;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_uint256>::
  pair(&local_80.first,&local_c0);
  local_80.second = pVar2;
  bVar1 = WriteIC<std::pair<std::pair<std::__cxx11::string,uint256>,std::pair<unsigned_int,unsigned_int>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    (this,&local_80,&ser_xpub,true);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_c0);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&ser_xpub.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool WalletBatch::WriteDescriptorDerivedCache(const CExtPubKey& xpub, const uint256& desc_id, uint32_t key_exp_index, uint32_t der_index)
{
    std::vector<unsigned char> ser_xpub(BIP32_EXTKEY_SIZE);
    xpub.Encode(ser_xpub.data());
    return WriteIC(std::make_pair(std::make_pair(DBKeys::WALLETDESCRIPTORCACHE, desc_id), std::make_pair(key_exp_index, der_index)), ser_xpub);
}